

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void replaceFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  sqlite3 *z;
  uchar *puVar7;
  uchar *__s2;
  uchar *__src;
  void *pvVar8;
  sqlite3_context *in_RDI;
  u8 *zOld;
  sqlite3 *db;
  uint cntExpand;
  int j;
  int i;
  int loopLimit;
  i64 nOut;
  int nRep;
  int nPattern;
  int nStr;
  uchar *zOut;
  uchar *zRep;
  uchar *zPattern;
  uchar *zStr;
  _func_void_void_ptr *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  undefined4 uVar9;
  uint uVar10;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long local_50;
  void *local_38;
  
  uVar11 = 0xaaaaaaaa;
  uVar9 = 0xaaaaaaaa;
  z = sqlite3_context_db_handle(in_RDI);
  puVar7 = sqlite3_value_text((sqlite3_value *)0x224e85);
  if (puVar7 != (uchar *)0x0) {
    iVar1 = sqlite3_value_bytes((sqlite3_value *)0x224ea4);
    __s2 = sqlite3_value_text((sqlite3_value *)0x224eb6);
    if (__s2 != (uchar *)0x0) {
      if (*__s2 == '\0') {
        sqlite3_result_text((sqlite3_context *)CONCAT44(uVar11,uVar9),(char *)z,
                            (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                            in_stack_ffffffffffffff88);
      }
      else {
        iVar2 = sqlite3_value_bytes((sqlite3_value *)0x224f02);
        __src = sqlite3_value_text((sqlite3_value *)0x224f14);
        if (__src != (uchar *)0x0) {
          iVar3 = sqlite3_value_bytes((sqlite3_value *)0x224f34);
          local_50 = (long)(iVar1 + 1);
          local_38 = contextMalloc((sqlite3_context *)CONCAT44(uVar11,uVar9),(i64)z);
          if (local_38 != (void *)0x0) {
            iVar4 = iVar1 - iVar2;
            iVar12 = 0;
            uVar10 = 0;
            for (iVar14 = 0; iVar13 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                iVar14 <= iVar4; iVar14 = iVar14 + 1) {
              uVar6 = uVar10;
              iVar13 = iVar12;
              if ((puVar7[iVar14] == *__s2) &&
                 (iVar5 = memcmp(puVar7 + iVar14,__s2,(long)iVar2), uVar6 = uVar10, iVar13 = iVar12,
                 iVar5 == 0)) {
                if (iVar2 < iVar3) {
                  local_50 = (iVar3 - iVar2) + local_50;
                  if ((long)z->aLimit[0] < local_50 + -1) {
                    sqlite3_result_error_toobig((sqlite3_context *)0x225044);
                    sqlite3_free((void *)0x22504e);
                    return;
                  }
                  uVar6 = uVar10 + 1;
                  if (((uVar6 & uVar10) == 0) &&
                     (pvVar8 = sqlite3Realloc((void *)CONCAT44(iVar4,iVar14),CONCAT44(iVar12,uVar6))
                     , in_stack_ffffffffffffff90 = local_38, local_38 = pvVar8,
                     pvVar8 == (void *)0x0)) {
                    sqlite3_result_error_nomem((sqlite3_context *)0x2250c6);
                    sqlite3_free((void *)0x2250d0);
                    return;
                  }
                }
                memcpy((void *)((long)local_38 + (long)iVar12),__src,(long)iVar3);
                iVar12 = iVar3 + iVar12;
                iVar14 = iVar2 + -1 + iVar14;
              }
              else {
                iVar12 = iVar13 + 1;
                *(uchar *)((long)local_38 + (long)iVar13) = puVar7[iVar14];
              }
              uVar10 = uVar6;
            }
            memcpy((void *)((long)local_38 + (long)iVar12),puVar7 + iVar14,(long)(iVar1 - iVar14));
            iVar12 = (iVar1 - iVar14) + iVar12;
            *(undefined1 *)((long)local_38 + (long)iVar12) = 0;
            sqlite3_result_text((sqlite3_context *)CONCAT44(iVar12,uVar10),(char *)z,iVar13,
                                in_stack_ffffffffffffff88);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void replaceFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zStr;        /* The input string A */
  const unsigned char *zPattern;    /* The pattern string B */
  const unsigned char *zRep;        /* The replacement string C */
  unsigned char *zOut;              /* The output */
  int nStr;                /* Size of zStr */
  int nPattern;            /* Size of zPattern */
  int nRep;                /* Size of zRep */
  i64 nOut;                /* Maximum size of zOut */
  int loopLimit;           /* Last zStr[] that might match zPattern[] */
  int i, j;                /* Loop counters */
  unsigned cntExpand;      /* Number zOut expansions */
  sqlite3 *db = sqlite3_context_db_handle(context);

  assert( argc==3 );
  UNUSED_PARAMETER(argc);
  zStr = sqlite3_value_text(argv[0]);
  if( zStr==0 ) return;
  nStr = sqlite3_value_bytes(argv[0]);
  assert( zStr==sqlite3_value_text(argv[0]) );  /* No encoding change */
  zPattern = sqlite3_value_text(argv[1]);
  if( zPattern==0 ){
    assert( sqlite3_value_type(argv[1])==SQLITE_NULL
            || sqlite3_context_db_handle(context)->mallocFailed );
    return;
  }
  if( zPattern[0]==0 ){
    assert( sqlite3_value_type(argv[1])!=SQLITE_NULL );
    sqlite3_result_text(context, (const char*)zStr, nStr, SQLITE_TRANSIENT);
    return;
  }
  nPattern = sqlite3_value_bytes(argv[1]);
  assert( zPattern==sqlite3_value_text(argv[1]) );  /* No encoding change */
  zRep = sqlite3_value_text(argv[2]);
  if( zRep==0 ) return;
  nRep = sqlite3_value_bytes(argv[2]);
  assert( zRep==sqlite3_value_text(argv[2]) );
  nOut = nStr + 1;
  assert( nOut<SQLITE_MAX_LENGTH );
  zOut = contextMalloc(context, (i64)nOut);
  if( zOut==0 ){
    return;
  }
  loopLimit = nStr - nPattern;
  cntExpand = 0;
  for(i=j=0; i<=loopLimit; i++){
    if( zStr[i]!=zPattern[0] || memcmp(&zStr[i], zPattern, nPattern) ){
      zOut[j++] = zStr[i];
    }else{
      if( nRep>nPattern ){
        nOut += nRep - nPattern;
        testcase( nOut-1==db->aLimit[SQLITE_LIMIT_LENGTH] );
        testcase( nOut-2==db->aLimit[SQLITE_LIMIT_LENGTH] );
        if( nOut-1>db->aLimit[SQLITE_LIMIT_LENGTH] ){
          sqlite3_result_error_toobig(context);
          sqlite3_free(zOut);
          return;
        }
        cntExpand++;
        if( (cntExpand&(cntExpand-1))==0 ){
          /* Grow the size of the output buffer only on substitutions
          ** whose index is a power of two: 1, 2, 4, 8, 16, 32, ... */
          u8 *zOld;
          zOld = zOut;
          zOut = sqlite3Realloc(zOut, (int)nOut + (nOut - nStr - 1));
          if( zOut==0 ){
            sqlite3_result_error_nomem(context);
            sqlite3_free(zOld);
            return;
          }
        }
      }
      memcpy(&zOut[j], zRep, nRep);
      j += nRep;
      i += nPattern-1;
    }
  }
  assert( j+nStr-i+1<=nOut );
  memcpy(&zOut[j], &zStr[i], nStr-i);
  j += nStr - i;
  assert( j<=nOut );
  zOut[j] = 0;
  sqlite3_result_text(context, (char*)zOut, j, sqlite3_free);
}